

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-canvas.c
# Opt level: O0

float plutovg_canvas_add_text
                (plutovg_canvas_t *canvas,void *text,int length,plutovg_text_encoding_t encoding,
                float x,float y)

{
  _Bool _Var1;
  plutovg_codepoint_t codepoint_00;
  float fVar2;
  float local_54;
  plutovg_codepoint_t codepoint;
  float advance_width;
  plutovg_text_iterator_t it;
  plutovg_state_t *state;
  float y_local;
  float x_local;
  plutovg_text_encoding_t encoding_local;
  int length_local;
  void *text_local;
  plutovg_canvas_t *canvas_local;
  
  it._16_8_ = canvas->state;
  if ((((plutovg_state_t *)it._16_8_)->font_face == (plutovg_font_face_t *)0x0) ||
     (((plutovg_state_t *)it._16_8_)->font_size <= 0.0)) {
    canvas_local._4_4_ = 0.0;
  }
  else {
    plutovg_text_iterator_init((plutovg_text_iterator_t *)&codepoint,text,length,encoding);
    local_54 = 0.0;
    while( true ) {
      _Var1 = plutovg_text_iterator_has_next((plutovg_text_iterator_t *)&codepoint);
      if (!_Var1) break;
      codepoint_00 = plutovg_text_iterator_next((plutovg_text_iterator_t *)&codepoint);
      fVar2 = plutovg_font_face_get_glyph_path
                        (*(plutovg_font_face_t **)(it._16_8_ + 8),*(float *)(it._16_8_ + 0x88),
                         x + local_54,y,codepoint_00,canvas->path);
      local_54 = fVar2 + local_54;
    }
    canvas_local._4_4_ = local_54;
  }
  return canvas_local._4_4_;
}

Assistant:

float plutovg_canvas_add_text(plutovg_canvas_t* canvas, const void* text, int length, plutovg_text_encoding_t encoding, float x, float y)
{
    plutovg_state_t* state = canvas->state;
    if(state->font_face == NULL || state->font_size <= 0.f)
        return 0.f;
    plutovg_text_iterator_t it;
    plutovg_text_iterator_init(&it, text, length, encoding);
    float advance_width = 0.f;
    while(plutovg_text_iterator_has_next(&it)) {
        plutovg_codepoint_t codepoint = plutovg_text_iterator_next(&it);
        advance_width += plutovg_font_face_get_glyph_path(state->font_face, state->font_size, x + advance_width, y, codepoint, canvas->path);
    }

    return advance_width;
}